

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O2

void __thiscall PeriodicTable::PeriodicTable(PeriodicTable *this)

{
  element *this_00;
  long lVar1;
  element x;
  
  (this->table).super__Vector_base<element,_std::allocator<element>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table).super__Vector_base<element,_std::allocator<element>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table).super__Vector_base<element,_std::allocator<element>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar1 = -0x76; lVar1 != 0; lVar1 = lVar1 + 1) {
    x.name._M_string_length = 0;
    x.name.field_2._M_local_buf[0] = '\0';
    x.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    x.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    x.isotopes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    x.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    x.isotopes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    x.isotopes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    x.z = (short)lVar1 + 0x77;
    this_00 = &x;
    x.name._M_dataplus._M_p = (pointer)&x.name.field_2;
    std::__cxx11::string::_M_assign((string *)&x);
    addIsotopesTo((PeriodicTable *)this_00,&x);
    std::vector<element,_std::allocator<element>_>::push_back(&this->table,&x);
    element::~element(&x);
  }
  return;
}

Assistant:

PeriodicTable::PeriodicTable()
{
    for(uint16_t z = 1; z <= N_ELEMENTS; z++)
    {
        element x;
        x.z = z;
        x.name = element_names[z];
        addIsotopesTo(x);
        table.push_back(x);
    }
}